

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTestList.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1fffe::TestAddingSecondTestAddsItToEndOfList::
TestAddingSecondTestAddsItToEndOfList(TestAddingSecondTestAddsItToEndOfList *this)

{
  char *suiteName;
  TestAddingSecondTestAddsItToEndOfList *this_local;
  
  suiteName = UnitTestSuite::GetSuiteName();
  UnitTest::Test::Test
            (&this->super_Test,"AddingSecondTestAddsItToEndOfList",suiteName,
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/UnitTest++/src/tests/TestTestList.cpp"
             ,0x19);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__TestAddingSecondTestAddsItToEndOfList_00184740
  ;
  return;
}

Assistant:

TEST (AddingSecondTestAddsItToEndOfList)
{
    Test test1("test1");
    Test test2("test2");

    TestList list;
    list.Add(&test1);
    list.Add(&test2);

    CHECK (list.GetHead() == &test1);
    CHECK (test1.next == &test2);
    CHECK (test2.next == 0);
}